

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O0

Var JSON::Parse(JavascriptString *input,RecyclableObject *reviver,ScriptContext *scriptContext)

{
  anon_class_8_1_65cf2d5d local_108;
  anon_class_40_5_edcffda5 local_100;
  Var local_d8;
  Var result;
  JSONParser parser;
  ScriptContext *scriptContext_local;
  RecyclableObject *reviver_local;
  JavascriptString *input_local;
  
  parser.typeCacheList = (JsonTypeCacheList *)scriptContext;
  scriptContext_local = (ScriptContext *)reviver;
  reviver_local = &input->super_RecyclableObject;
  JSONParser::JSONParser((JSONParser *)&result,scriptContext,reviver);
  local_d8 = (Var)0x0;
  local_100.input = (JavascriptString **)&reviver_local;
  local_100.result = &local_d8;
  local_100.parser = (JSONParser *)&result;
  local_100.scriptContext = (ScriptContext **)&parser.typeCacheList;
  local_100.reviver = (RecyclableObject **)&scriptContext_local;
  local_108.parser = (JSONParser *)&result;
  TryFinally<JSON::Parse(Js::JavascriptString*,Js::RecyclableObject*,Js::ScriptContext*)::__0,JSON::Parse(Js::JavascriptString*,Js::RecyclableObject*,Js::ScriptContext*)::__1>
            (&local_100,&local_108);
  return local_d8;
}

Assistant:

Js::Var Parse(Js::JavascriptString* input, Js::RecyclableObject* reviver, Js::ScriptContext* scriptContext)
    {
        // alignment required because of the union in JSONParser::m_token
        __declspec (align(8)) JSONParser parser(scriptContext, reviver);
        Js::Var result = NULL;

        TryFinally([&]()
        {
            LazyJSONString* lazyString = JavascriptOperators::TryFromVar<LazyJSONString>(input);
            if (lazyString)
            {
                // Try to reconstruct object based on the data collected during stringify
                // In case of semantically important gap, this call may fail and we will need to do real parse
                result = lazyString->TryParse();
            }
            if (result == nullptr)
            {
                result = parser.Parse(input);
            }

    #ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (CONFIG_FLAG(ForceGCAfterJSONParse))
            {
                Recycler* recycler = scriptContext->GetRecycler();
                recycler->CollectNow<CollectNowForceInThread>();
            }
    #endif

            if (reviver)
            {
                Js::DynamicObject* root = scriptContext->GetLibrary()->CreateObject();
                JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(root));
                Js::PropertyId propertyId = scriptContext->GetEmptyStringPropertyId();
                Js::JavascriptOperators::InitProperty(root, propertyId, result);
                result = parser.Walk(scriptContext->GetLibrary()->GetEmptyString(), propertyId, root);
            }
        },
            [&](bool/*hasException*/)
        {
            parser.Finalizer();
        });

        return result;
    }